

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

uint32_t helper_advsimd_rinth_aarch64(uint32_t x,void *fp_status)

{
  float16 fVar1;
  uint uVar2;
  float16 ret;
  int new_flags;
  int old_flags;
  void *fp_status_local;
  uint32_t x_local;
  
  uVar2 = get_float_exception_flags((float_status *)fp_status);
  fVar1 = float16_round_to_int_aarch64((float16)x,(float_status *)fp_status);
  if ((uVar2 & 0x20) == 0) {
    uVar2 = get_float_exception_flags((float_status *)fp_status);
    set_float_exception_flags(uVar2 & 0xffffffdf,(float_status *)fp_status);
  }
  return (uint32_t)fVar1;
}

Assistant:

uint32_t HELPER(advsimd_rinth)(uint32_t x, void *fp_status)
{
    int old_flags = get_float_exception_flags(fp_status), new_flags;
    float16 ret;

    ret = float16_round_to_int(x, fp_status);

    /* Suppress any inexact exceptions the conversion produced */
    if (!(old_flags & float_flag_inexact)) {
        new_flags = get_float_exception_flags(fp_status);
        set_float_exception_flags(new_flags & ~float_flag_inexact, fp_status);
    }

    return ret;
}